

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

Nwk_Vrt_t * Nwk_ManGraphListFindMin(Nwk_Grf_t *p,int List)

{
  int iVar1;
  int iVar2;
  Nwk_Vrt_t *pNVar3;
  Nwk_Vrt_t *pNVar4;
  int iVar5;
  Nwk_Vrt_t *pNVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  
  if (List != 0) {
    pNVar6 = p->pVerts[List];
    if (pNVar6 == (Nwk_Vrt_t *)0x0) {
      pNVar3 = (Nwk_Vrt_t *)0x0;
    }
    else {
      iVar5 = 10000;
      iVar7 = 1000000;
      pNVar3 = (Nwk_Vrt_t *)0x0;
      do {
        if (0 < (long)pNVar6->nEdges) {
          lVar8 = 0;
          do {
            iVar1 = p->pVerts[(&pNVar6[1].Id)[lVar8]]->nEdges;
            iVar2 = iVar7;
            if (iVar1 <= iVar7) {
              iVar2 = iVar1;
            }
            pNVar4 = pNVar3;
            if (iVar1 < iVar7) {
              pNVar4 = pNVar6;
            }
            bVar9 = pNVar3 == (Nwk_Vrt_t *)0x0;
            iVar7 = iVar2;
            pNVar3 = pNVar4;
            if (bVar9) {
              iVar7 = iVar1;
              pNVar3 = pNVar6;
            }
            lVar8 = lVar8 + 1;
          } while (pNVar6->nEdges != lVar8);
        }
        iVar5 = iVar5 + -1;
      } while (((iVar5 != 0) && ((long)pNVar6->iNext != 0)) &&
              (pNVar6 = p->pVerts[pNVar6->iNext], pNVar6 != (Nwk_Vrt_t *)0x0));
    }
    return pNVar3;
  }
  return (Nwk_Vrt_t *)0x0;
}

Assistant:

Nwk_Vrt_t * Nwk_ManGraphListFindMin( Nwk_Grf_t * p, int List )
{
    Nwk_Vrt_t * pThis, * pMinCost = NULL;
    int k, Counter = 10000, BestCost = 1000000;
    Nwk_ListForEachVertex( p, List, pThis )
    {
        for ( k = 0; k < pThis->nEdges; k++ )
        {
            if ( pMinCost == NULL || BestCost > p->pVerts[pThis->pEdges[k]]->nEdges )
            {
                BestCost = p->pVerts[pThis->pEdges[k]]->nEdges;
                pMinCost = pThis;
            }
        }
        if ( --Counter == 0 )
            break;
    }
    return pMinCost;
}